

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::ScrollArea::ensureVisible(ScrollArea *this,int x,int y,int xmargin,int ymargin)

{
  AbstractScrollAreaPrivate *pAVar1;
  LayoutDirection LVar2;
  int iVar3;
  QPoint *pQVar4;
  QSize *pQVar5;
  int iVar6;
  int iVar7;
  QRect local_48;
  QPoint local_38;
  
  pAVar1 = (this->super_AbstractScrollArea).d.d;
  LVar2 = QWidget::layoutDirection();
  local_48 = QWidget::rect(pAVar1->viewport);
  local_38.xp = x;
  local_38.yp = y;
  iVar3 = QStyle::visualPos(LVar2,&local_48,&local_38);
  iVar7 = iVar3 - xmargin;
  pQVar4 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
  if (iVar7 < pQVar4->xp) {
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
  }
  else {
    pQVar4 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
    iVar7 = *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x1c) -
            *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x14);
    iVar6 = 0;
    if ((pQVar4->xp - xmargin) + iVar7 + 1 < iVar3) {
      iVar6 = (iVar3 + xmargin) - (iVar7 + 1);
      pQVar5 = AbstractScrollArea::scrolledAreaSize(&this->super_AbstractScrollArea);
      if (pQVar5->wd <= iVar6) {
        iVar6 = pQVar5->wd;
      }
    }
  }
  iVar3 = y - ymargin;
  pQVar4 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
  if (iVar3 < pQVar4->yp) {
    iVar7 = 0;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
  }
  else {
    pQVar4 = AbstractScrollArea::topLeftPointShownArea(&this->super_AbstractScrollArea);
    iVar3 = *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) -
            *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18);
    iVar7 = 0;
    if ((pQVar4->yp - ymargin) + iVar3 + 1 < y) {
      iVar7 = (ymargin + y) - (iVar3 + 1);
      pQVar5 = AbstractScrollArea::scrolledAreaSize(&this->super_AbstractScrollArea);
      if (pQVar5->ht <= iVar7) {
        iVar7 = pQVar5->ht;
      }
    }
  }
  local_48.y1 = iVar7;
  local_48.x1 = iVar6;
  AbstractScrollArea::setTopLeftPointShownArea(&this->super_AbstractScrollArea,(QPoint *)&local_48);
  return;
}

Assistant:

void
ScrollArea::ensureVisible( int x, int y, int xmargin, int ymargin )
{
	ScrollAreaPrivate * d = d_func();

	int logicalX = QStyle::visualPos( layoutDirection(), d->viewport->rect(),
		QPoint( x, y ) ).x();

	int posX = 0;
	int posY = 0;

	if( logicalX - xmargin < topLeftPointShownArea().x() )
		posX = qMax( 0, logicalX - xmargin );
	else if( logicalX > topLeftPointShownArea().x() + d->viewport->width() - xmargin )
		posX = qMin( logicalX - d->viewport->width() + xmargin,
			scrolledAreaSize().width() );

	if( y - ymargin < topLeftPointShownArea().y() )
		posY = qMax( 0, y - ymargin );
	else if( y > topLeftPointShownArea().y() + d->viewport->height() - ymargin )
		posY= qMin( y - d->viewport->height() + ymargin,
			scrolledAreaSize().height() );

	setTopLeftPointShownArea( QPoint( posX, posY ) );
}